

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationSingleQueueTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::synchronization::anon_unknown_2::EventTestInstance::iterate
          (TestStatus *__return_storage_ptr__,EventTestInstance *this)

{
  VkCommandBuffer_s *pVVar1;
  VkDeviceSize offset;
  VkImage image;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::Handle<(vk::HandleType)10>_> data_01;
  bool bVar2;
  int iVar3;
  int iVar4;
  ResourceType RVar5;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Handle<(vk::HandleType)24> *pHVar6;
  Operation *pOVar7;
  VkAccessFlags srcAccessMask;
  VkAccessFlags dstAccessMask;
  VkCommandBuffer_s **ppVVar8;
  Handle<(vk::HandleType)10> *pHVar9;
  Resource *pRVar10;
  BufferResource *pBVar11;
  ImageResource *pIVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VkPipelineStageFlags extraout_EDX;
  VkImageLayout newLayout;
  void *a;
  void *b;
  UniquePtr<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
  *pUVar13;
  allocator<char> local_2d1;
  string local_2d0;
  undefined4 local_2b0;
  allocator<char> local_2a9;
  string local_2a8;
  undefined8 local_288;
  Data actual;
  Data expected;
  undefined1 local_240 [8];
  VkImageMemoryBarrier barrier_1;
  undefined1 local_1f0 [8];
  VkBufferMemoryBarrier barrier;
  SyncInfo readSync;
  SyncInfo writeSync;
  RefData<vk::Handle<(vk::HandleType)10>_> local_150;
  undefined1 local_130 [8];
  Unique<vk::Handle<(vk::HandleType)10>_> event;
  Move<vk::VkCommandBuffer_s_*> local_108;
  RefData<vk::VkCommandBuffer_s_*> local_e8;
  undefined1 local_c8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  Move<vk::Handle<(vk::HandleType)24>_> local_98;
  RefData<vk::Handle<(vk::HandleType)24>_> local_78;
  undefined1 local_58 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  EventTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_BaseTestInstance).super_TestInstance.m_context);
  device_00 = Context::getDevice((this->super_BaseTestInstance).super_TestInstance.m_context);
  queue_00 = Context::getUniversalQueue((this->super_BaseTestInstance).super_TestInstance.m_context)
  ;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_ =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_BaseTestInstance).super_TestInstance.m_context);
  ::vk::createCommandPool
            (&local_98,vk_00,device_00,2,
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_
             ,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data.object.m_internal = local_78.object.m_internal;
  data.deleter.m_device._0_4_ = (int)local_78.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_78.deleter.m_device >> 0x20);
  data.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_58,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_98);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_58);
  event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar6->m_internal;
  makeCommandBuffer(&local_108,vk_00,device_00,
                    (VkCommandPool)
                    event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e8,(Move *)&local_108);
  data_00.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data_00.object = local_e8.object;
  data_00.deleter.m_device._0_4_ = (int)local_e8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_e8.deleter.m_device >> 0x20);
  data_00.deleter.m_pool.m_internal = local_e8.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_c8,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_108);
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&writeSync.imageLayout,vk_00,device_00,
                    0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_150,(Move *)&writeSync.imageLayout);
  data_01.deleter.m_deviceIface = local_150.deleter.m_deviceIface;
  data_01.object.m_internal = local_150.object.m_internal;
  data_01.deleter.m_device._0_4_ = (int)local_150.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_150.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator = local_150.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_130,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)10>_> *)&writeSync.imageLayout);
  pOVar7 = de::details::
           UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           ::operator->(&(this->super_BaseTestInstance).m_writeOp.
                         super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                       );
  iVar3 = (*pOVar7->_vptr_Operation[3])();
  writeSync.stageMask = extraout_EDX;
  pOVar7 = de::details::
           UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           ::operator->(&(this->super_BaseTestInstance).m_readOp.
                         super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                       );
  iVar4 = (*pOVar7->_vptr_Operation[3])();
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_c8);
  beginCommandBuffer(vk_00,*ppVVar8);
  pOVar7 = de::details::
           UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           ::operator->(&(this->super_BaseTestInstance).m_writeOp.
                         super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                       );
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_c8);
  (*pOVar7->_vptr_Operation[2])(pOVar7,*ppVVar8);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_c8);
  pVVar1 = *ppVVar8;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_130);
  barrier.size = pHVar9->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x6a])(vk_00,pVVar1,barrier.size,iVar3);
  pRVar10 = de::details::
            UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
            ::operator->(&(this->super_BaseTestInstance).m_resource.
                          super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                        );
  RVar5 = Resource::getType(pRVar10);
  if (RVar5 != RESOURCE_TYPE_BUFFER) {
    pRVar10 = de::details::
              UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
              ::operator->(&(this->super_BaseTestInstance).m_resource.
                            super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                          );
    RVar5 = Resource::getType(pRVar10);
    bVar2 = isIndirectBuffer(RVar5);
    if (!bVar2) {
      pRVar10 = de::details::
                UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                ::operator->(&(this->super_BaseTestInstance).m_resource.
                              super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                            );
      RVar5 = Resource::getType(pRVar10);
      if (RVar5 == RESOURCE_TYPE_IMAGE) {
        pUVar13 = &(this->super_BaseTestInstance).m_resource;
        pRVar10 = de::details::
                  UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                  ::operator->(&pUVar13->
                                super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                              );
        pIVar12 = Resource::getImage(pRVar10);
        image.m_internal = (pIVar12->handle).m_internal;
        pRVar10 = de::details::
                  UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                  ::operator->(&pUVar13->
                                super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                              );
        pIVar12 = Resource::getImage(pRVar10);
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)local_240,srcAccessMask,dstAccessMask,writeSync.stageMask
                   ,newLayout,image,pIVar12->subresourceRange);
        ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                            ((RefBase<vk::VkCommandBuffer_s_*> *)local_c8);
        pVVar1 = *ppVVar8;
        pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::get
                           ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_130);
        (*vk_00->_vptr_DeviceInterface[0x6c])(vk_00,pVVar1,1,pHVar9,iVar3,iVar4,0,0,0,0,1,local_240)
        ;
      }
      goto LAB_00e3eb17;
    }
  }
  pUVar13 = &(this->super_BaseTestInstance).m_resource;
  pRVar10 = de::details::
            UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
            ::operator->(&pUVar13->
                          super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                        );
  pBVar11 = Resource::getBuffer(pRVar10);
  barrier_1._64_8_ = (pBVar11->handle).m_internal;
  pRVar10 = de::details::
            UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
            ::operator->(&pUVar13->
                          super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                        );
  pBVar11 = Resource::getBuffer(pRVar10);
  offset = pBVar11->offset;
  pRVar10 = de::details::
            UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
            ::operator->(&pUVar13->
                          super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
                        );
  pBVar11 = Resource::getBuffer(pRVar10);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_1f0,srcAccessMask,dstAccessMask,
             (VkBuffer)barrier_1._64_8_,offset,pBVar11->size);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_c8);
  pVVar1 = *ppVVar8;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_130);
  (*vk_00->_vptr_DeviceInterface[0x6c])(vk_00,pVVar1,1,pHVar9,iVar3,iVar4,0,0,1,local_1f0,0,0);
LAB_00e3eb17:
  pOVar7 = de::details::
           UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           ::operator->(&(this->super_BaseTestInstance).m_readOp.
                         super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                       );
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_c8);
  (*pOVar7->_vptr_Operation[2])(pOVar7,*ppVVar8);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_c8);
  endCommandBuffer(vk_00,*ppVVar8);
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_c8);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar8);
  pOVar7 = de::details::
           UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           ::operator->(&(this->super_BaseTestInstance).m_writeOp.
                         super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                       );
  iVar3 = (*pOVar7->_vptr_Operation[4])();
  actual.data = (deUint8 *)CONCAT44(extraout_var,iVar3);
  pOVar7 = de::details::
           UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           ::operator->(&(this->super_BaseTestInstance).m_readOp.
                         super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
                       );
  iVar3 = (*pOVar7->_vptr_Operation[4])();
  local_288 = CONCAT44(extraout_var_00,iVar3);
  iVar3 = deMemCmp(a,b,(size_t)actual.data);
  if (iVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"OK",&local_2d1);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"Memory contents don\'t match",&local_2a9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
  }
  local_2b0 = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_130);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					device				= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));
		const Unique<VkEvent>			event				(createEvent(vk, device));
		const SyncInfo					writeSync			= m_writeOp->getSyncInfo();
		const SyncInfo					readSync			= m_readOp->getSyncInfo();

		beginCommandBuffer(vk, *cmdBuffer);

		m_writeOp->recordCommands(*cmdBuffer);
		vk.cmdSetEvent(*cmdBuffer, *event, writeSync.stageMask);

		if (m_resource->getType() == RESOURCE_TYPE_BUFFER || isIndirectBuffer(m_resource->getType()))
		{
			const VkBufferMemoryBarrier barrier = makeBufferMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				m_resource->getBuffer().handle, m_resource->getBuffer().offset, m_resource->getBuffer().size);
			vk.cmdWaitEvents(*cmdBuffer, 1u, &event.get(), writeSync.stageMask, readSync.stageMask, 0u, DE_NULL, 1u, &barrier, 0u, DE_NULL);
		}
		else if (m_resource->getType() == RESOURCE_TYPE_IMAGE)
		{
			const VkImageMemoryBarrier barrier =  makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				writeSync.imageLayout, readSync.imageLayout, m_resource->getImage().handle, m_resource->getImage().subresourceRange);
			vk.cmdWaitEvents(*cmdBuffer, 1u, &event.get(), writeSync.stageMask, readSync.stageMask, 0u, DE_NULL, 0u, DE_NULL, 1u, &barrier);
		}

		m_readOp->recordCommands(*cmdBuffer);

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		{
			const Data	expected = m_writeOp->getData();
			const Data	actual	 = m_readOp->getData();

			if (0 != deMemCmp(expected.data, actual.data, expected.size))
				return tcu::TestStatus::fail("Memory contents don't match");
		}

		return tcu::TestStatus::pass("OK");
	}